

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O2

float min_elem(float *arr,int length)

{
  float fVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = *arr;
  for (lVar2 = 1; lVar2 < length; lVar2 = lVar2 + 1) {
    fVar1 = arr[lVar2];
    fVar4 = fVar1;
    if (fVar1 <= 0.001) {
      fVar4 = fVar3;
    }
    fVar3 = (float)(~-(uint)(fVar1 < fVar3) & (uint)fVar3 | (uint)fVar4 & -(uint)(fVar1 < fVar3));
  }
  return fVar3;
}

Assistant:

float min_elem(float* arr, int length)
{
  float min = arr[0];
  for (int i = 1; i < length; i++)
    if (arr[i] < min && arr[i] > 0.001)
      min = arr[i];
  return min;
}